

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

void resolve_when_ctx_snode(lys_node *schema,lys_node **ctx_snode,lyxp_node_type *ctx_snode_type)

{
  lys_module *module;
  lys_node *node;
  lys_node **pplVar1;
  
  *ctx_snode_type = LYXP_NODE_ELEM;
  do {
    node = schema;
    if ((node->nodetype & (LYS_AUGMENT|LYS_USES|LYS_OUTPUT|LYS_INPUT|LYS_CASE|LYS_CHOICE)) ==
        LYS_UNKNOWN) goto LAB_00116889;
    pplVar1 = &node->parent;
    if (node->nodetype == LYS_AUGMENT) {
      pplVar1 = &node->prev;
    }
    schema = *pplVar1;
  } while (*pplVar1 != (lys_node *)0x0);
  *ctx_snode_type = node->flags & LYXP_NODE_ROOT_CONFIG;
  module = lys_node_module(node);
  node = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
LAB_00116889:
  *ctx_snode = node;
  return;
}

Assistant:

void
resolve_when_ctx_snode(const struct lys_node *schema, struct lys_node **ctx_snode, enum lyxp_node_type *ctx_snode_type)
{
    const struct lys_node *sparent;

    /* find a not schema-only node */
    *ctx_snode_type = LYXP_NODE_ELEM;
    while (schema->nodetype & (LYS_USES | LYS_CHOICE | LYS_CASE | LYS_AUGMENT | LYS_INPUT | LYS_OUTPUT)) {
        if (schema->nodetype == LYS_AUGMENT) {
            sparent = ((struct lys_node_augment *)schema)->target;
        } else {
            sparent = schema->parent;
        }
        if (!sparent) {
            /* context node is the document root (fake root in our case) */
            if (schema->flags & LYS_CONFIG_W) {
                *ctx_snode_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                *ctx_snode_type = LYXP_NODE_ROOT;
            }
            /* we need the first top-level sibling, but no uses or groupings */
            schema = lys_getnext(NULL, NULL, lys_node_module(schema), 0);
            break;
        }
        schema = sparent;
    }

    *ctx_snode = (struct lys_node *)schema;
}